

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAX2Print.cpp
# Opt level: O0

void usage(void)

{
  ostream *this;
  
  this = std::operator<<((ostream *)&std::cout,
                         "\nUsage:\n    SAX2Print [options] <XML file>\n\nThis program invokes the SAX2XMLReader, and then prints the\ndata returned by the various SAX2 handlers for the specified\nXML file.\n\nOptions:\n    -u=xxx      Handle unrepresentable chars [fail | rep | ref*].\n    -v=xxx      Validation scheme [always | never | auto*].\n    -e          Expand Namespace Alias with URI\'s. Defaults to off.\n    -x=XXX      Use a particular encoding for output (LATIN1*).\n    -f          Enable full schema constraint checking processing. Defaults to off.\n    -p          Enable namespace-prefixes feature. Defaults to off.\n    -n          Disable namespace processing. Defaults to on.\n                NOTE: THIS IS OPPOSITE FROM OTHER SAMPLES.\n    -s          Disable schema processing. Defaults to on.\n                NOTE: THIS IS OPPOSITE FROM OTHER SAMPLES.\n    -sa         Print the attributes in alphabetic order. Defaults to off.\n    -?          Show this help.\n\n  * = Default if not provided explicitly.\n\nThe parser has intrinsic support for the following encodings:\n    UTF-8, US-ASCII, ISO8859-1, UTF-16[BL]E, UCS-4[BL]E,\n    WINDOWS-1252, IBM1140, IBM037, IBM1047.\n"
                        );
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

static void usage()
{
    std::cout << "\nUsage:\n"
            "    SAX2Print [options] <XML file>\n\n"
            "This program invokes the SAX2XMLReader, and then prints the\n"
            "data returned by the various SAX2 handlers for the specified\n"
            "XML file.\n\n"
            "Options:\n"
             "    -u=xxx      Handle unrepresentable chars [fail | rep | ref*].\n"
             "    -v=xxx      Validation scheme [always | never | auto*].\n"
             "    -e          Expand Namespace Alias with URI's. Defaults to off.\n"
             "    -x=XXX      Use a particular encoding for output (LATIN1*).\n"
             "    -f          Enable full schema constraint checking processing. Defaults to off.\n"
             "    -p          Enable namespace-prefixes feature. Defaults to off.\n"
             "    -n          Disable namespace processing. Defaults to on.\n"
             "                NOTE: THIS IS OPPOSITE FROM OTHER SAMPLES.\n"
             "    -s          Disable schema processing. Defaults to on.\n"
             "                NOTE: THIS IS OPPOSITE FROM OTHER SAMPLES.\n"
             "    -sa         Print the attributes in alphabetic order. Defaults to off.\n"
             "    -?          Show this help.\n\n"
             "  * = Default if not provided explicitly.\n\n"
             "The parser has intrinsic support for the following encodings:\n"
             "    UTF-8, US-ASCII, ISO8859-1, UTF-16[BL]E, UCS-4[BL]E,\n"
             "    WINDOWS-1252, IBM1140, IBM037, IBM1047.\n"
         <<  std::endl;
}